

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O2

void __thiscall
WordSplitOnceTest_random_vector_Test<char8_t>::TestBody
          (WordSplitOnceTest_random_vector_Test<char8_t> *this)

{
  value_type in_whitespace;
  char *pcVar1;
  AssertHelper aAStack_d8 [8];
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
  split_result;
  RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_> data;
  
  in_whitespace = '\0';
  RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_>::RandomWordTestData
            (&data,'\0',0,0);
  jessilib::
  word_split_once<std::vector<char8_t,std::allocator<char8_t>>,std::vector<char8_t,std::allocator<char8_t>>>
            (&split_result,(jessilib *)&data.m_str,(vector<char8_t,_std::allocator<char8_t>_> *)0x0,
             in_whitespace);
  testing::internal::
  CmpHelperEQ<std::vector<char8_t,std::allocator<char8_t>>,std::vector<char8_t,std::allocator<char8_t>>>
            ((internal *)&gtest_ar,"split_result.first","data.m_tokens[0]",&split_result.first,
             data.m_tokens.
             super__Vector_base<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x91,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_d8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(aAStack_d8);
    if ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_>::get_remainder
            ((vector<char8_t,_std::allocator<char8_t>_> *)&gtest_ar,&data,1);
  testing::internal::
  CmpHelperEQ<std::vector<char8_t,std::allocator<char8_t>>,std::vector<char8_t,std::allocator<char8_t>>>
            ((internal *)&gtest_ar_1,"split_result.second","data.get_remainder(1)",
             &split_result.second,(vector<char8_t,_std::allocator<char8_t>_> *)&gtest_ar);
  std::_Vector_base<char8_t,_std::allocator<char8_t>_>::~_Vector_base
            ((_Vector_base<char8_t,_std::allocator<char8_t>_> *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x92,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_d8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(aAStack_d8);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  std::
  pair<std::vector<char8_t,_std::allocator<char8_t>_>,_std::vector<char8_t,_std::allocator<char8_t>_>_>
  ::~pair(&split_result);
  RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_>::~RandomWordTestData
            (&data);
  return;
}

Assistant:

TYPED_TEST(WordSplitOnceTest, random_vector) {
	using vector_type = std::vector<TypeParam>;
	RandomWordTestData<TypeParam, vector_type> data{};
	std::pair<vector_type, vector_type> split_result = word_split_once<vector_type>(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}